

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O1

ON_wString PreJuly2023_TextureChildSlotName(ON_RenderMaterial *rm,ChildSlotUsage usage)

{
  bool bVar1;
  undefined *puVar2;
  int in_EDX;
  uint uVar3;
  undefined4 in_register_00000034;
  wchar_t *s;
  ON_Material local_150;
  
  (**(code **)(*(long *)CONCAT44(in_register_00000034,usage) + 600))(&local_150);
  bVar1 = ON_Material::IsPhysicallyBased(&local_150);
  ON_Material::~ON_Material(&local_150);
  uVar3 = in_EDX - 1;
  if (bVar1) {
    if ((7 < uVar3) || ((0x8bU >> (uVar3 & 0x1f) & 1) == 0)) {
      ON_REMOVE_ASAP_AssertEx
                (0,
                 "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_render_content.cpp"
                 ,0x596,"","false is false");
LAB_005a71ad:
      s = L"";
      goto LAB_005a71b4;
    }
    puVar2 = &DAT_006d9574;
  }
  else {
    if (7 < uVar3) goto LAB_005a71ad;
    puVar2 = &DAT_006d9594;
  }
  s = (wchar_t *)(puVar2 + *(int *)(puVar2 + (ulong)uVar3 * 4));
LAB_005a71b4:
  ON_wString::ON_wString((ON_wString *)rm,s);
  return (ON_wString)(wchar_t *)rm;
}

Assistant:

static ON_wString PreJuly2023_TextureChildSlotName(const ON_RenderMaterial& rm, ChildSlotUsage usage)
{
  if (rm.ToOnMaterial().IsPhysicallyBased())
    return PBR_ChildSlotNameFromUsage(usage);

  switch (usage)
  {
  case ChildSlotUsage::Diffuse:      return ON_TEXTURE_CHILD_SLOT_NAME_BITMAP_TEXTURE;
  case ChildSlotUsage::Bump:         return ON_TEXTURE_CHILD_SLOT_NAME_BUMP_TEXTURE;
  case ChildSlotUsage::Transparency: return ON_TEXTURE_CHILD_SLOT_NAME_TRANSPARENCY_TEXTURE;
  case ChildSlotUsage::Environment:  return ON_TEXTURE_CHILD_SLOT_NAME_ENVIRONMENT_TEXTURE;
  default: return L"";
  }
}